

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u32 jsonbArrayCount(JsonParse *pParse,u32 iRoot)

{
  u32 uVar1;
  uint i;
  uint uVar2;
  u32 uVar3;
  long in_FS_OFFSET;
  u32 sz;
  u32 local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0xaaaaaaaa;
  uVar1 = jsonbPayloadSize(pParse,iRoot,&local_34);
  i = iRoot + uVar1;
  uVar2 = local_34 + i;
  uVar3 = 0;
  if (i < uVar2 && uVar1 != 0) {
    uVar3 = 0;
    do {
      uVar1 = jsonbPayloadSize(pParse,i,&local_34);
      uVar3 = uVar3 + 1;
      if (uVar1 == 0) break;
      i = uVar1 + i + local_34;
    } while (i < uVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

static u32 jsonbArrayCount(JsonParse *pParse, u32 iRoot){
  u32 n, sz, i, iEnd;
  u32 k = 0;
  n = jsonbPayloadSize(pParse, iRoot, &sz);
  iEnd = iRoot+n+sz;
  for(i=iRoot+n; n>0 && i<iEnd; i+=sz+n, k++){
    n = jsonbPayloadSize(pParse, i, &sz);
  }
  return k;
}